

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.h
# Opt level: O0

void __thiscall
Assimp::ObjExporter::
indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::getKeys
          (indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare> *this,
          vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
          *keys)

{
  iterator this_00;
  bool bVar1;
  size_type __new_size;
  pointer ppVar2;
  pointer ppVar3;
  reference this_01;
  _Self local_28;
  _Self local_20;
  iterator it;
  vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
  *keys_local;
  indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare> *this_local;
  
  it._M_node = (_Base_ptr)keys;
  __new_size = std::
               map<Assimp::ObjExporter::vertexData,_int,_Assimp::ObjExporter::vertexDataCompare,_std::allocator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>_>
               ::size(&this->vecMap);
  std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>::
  resize(keys,__new_size);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<Assimp::ObjExporter::vertexData,_int,_Assimp::ObjExporter::vertexDataCompare,_std::allocator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>_>
       ::begin(&this->vecMap);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<Assimp::ObjExporter::vertexData,_int,_Assimp::ObjExporter::vertexDataCompare,_std::allocator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>_>
         ::end(&this->vecMap);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>::
             operator->(&local_20);
    this_00 = it;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>::
             operator->(&local_20);
    this_01 = std::
              vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
              ::operator[]((vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>
                            *)this_00._M_node,(long)(ppVar3->second + -1));
    vertexData::operator=(this_01,&ppVar2->first);
    std::_Rb_tree_iterator<std::pair<const_Assimp::ObjExporter::vertexData,_int>_>::operator++
              (&local_20);
  }
  return;
}

Assistant:

void getKeys( std::vector<T>& keys ) {
            keys.resize(vecMap.size());
            for(typename dataType::iterator it = vecMap.begin(); it != vecMap.end(); ++it){
                keys[it->second-1] = it->first;
            }
        }